

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O2

void scale_1_to_2_phase_0_row(uint8_t *src,uint8_t *dst,int w,__m128i *f)

{
  long lVar1;
  undefined8 extraout_XMM0_Qa;
  __m128i s [8];
  longlong local_b8 [3];
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar1 = 0;
  do {
    local_b8[0] = *(longlong *)(src + lVar1);
    local_b8[1] = 0;
    local_b8[2] = *(longlong *)(src + lVar1 + 1);
    uStack_a0 = 0;
    local_98 = *(undefined8 *)(src + lVar1 + 2);
    uStack_90 = 0;
    local_88 = *(undefined8 *)(src + lVar1 + 3);
    uStack_80 = 0;
    local_78 = *(undefined8 *)(src + lVar1 + 4);
    uStack_70 = 0;
    local_68 = *(undefined8 *)(src + lVar1 + 5);
    uStack_60 = 0;
    local_58 = *(undefined8 *)(src + lVar1 + 6);
    uStack_50 = 0;
    local_48 = *(undefined8 *)(src + lVar1 + 7);
    uStack_40 = 0;
    scale_1_to_2_phase_0_kernel((__m128i *)local_b8,f);
    *(undefined8 *)(dst + lVar1) = extraout_XMM0_Qa;
    lVar1 = lVar1 + 8;
  } while (w != (int)lVar1);
  return;
}

Assistant:

static void scale_1_to_2_phase_0_row(const uint8_t *src, uint8_t *dst,
                                     const int w, const __m128i *const f) {
  int x = w;

  do {
    __m128i s[8], temp;
    s[0] = _mm_loadl_epi64((const __m128i *)(src + 0));
    s[1] = _mm_loadl_epi64((const __m128i *)(src + 1));
    s[2] = _mm_loadl_epi64((const __m128i *)(src + 2));
    s[3] = _mm_loadl_epi64((const __m128i *)(src + 3));
    s[4] = _mm_loadl_epi64((const __m128i *)(src + 4));
    s[5] = _mm_loadl_epi64((const __m128i *)(src + 5));
    s[6] = _mm_loadl_epi64((const __m128i *)(src + 6));
    s[7] = _mm_loadl_epi64((const __m128i *)(src + 7));
    temp = scale_1_to_2_phase_0_kernel(s, f);
    _mm_storel_epi64((__m128i *)dst, temp);
    src += 8;
    dst += 8;
    x -= 8;
  } while (x);
}